

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.h
# Opt level: O0

crc32c_t absl::lts_20250127::ExtendCrc32c(crc32c_t initial_crc,string_view buf_to_add)

{
  bool bVar1;
  crc32c_t cVar2;
  size_type sVar3;
  const_pointer p;
  char *in_RCX;
  string_view buf_to_add_00;
  uint32_t local_24;
  undefined1 auStack_20 [4];
  uint32_t crc;
  string_view buf_to_add_local;
  crc32c_t initial_crc_local;
  
  buf_to_add_local._M_len = (size_t)buf_to_add._M_str;
  _auStack_20 = buf_to_add._M_len;
  buf_to_add_local._M_str._0_4_ = initial_crc.crc_;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  if (sVar3 < 0x41) {
    local_24 = crc32c_t::operator_cast_to_unsigned_int((crc32c_t *)&buf_to_add_local._M_str);
    p = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
    bVar1 = crc_internal::ExtendCrc32cInline(&local_24,p,sVar3);
    if (bVar1) {
      crc32c_t::crc32c_t((crc32c_t *)((long)&buf_to_add_local._M_str + 4),local_24);
      return (crc32c_t)buf_to_add_local._M_str._4_4_;
    }
  }
  buf_to_add_00._M_str = in_RCX;
  buf_to_add_00._M_len = buf_to_add_local._M_len;
  cVar2 = crc_internal::ExtendCrc32cInternal
                    ((crc_internal *)(ulong)buf_to_add_local._M_str._0_4_,(uint32_t)_auStack_20,
                     buf_to_add_00);
  return (crc32c_t)cVar2.crc_;
}

Assistant:

inline crc32c_t ExtendCrc32c(crc32c_t initial_crc,
                             absl::string_view buf_to_add) {
  // Approximately 75% of calls have size <= 64.
  if (buf_to_add.size() <= 64) {
    uint32_t crc = static_cast<uint32_t>(initial_crc);
    if (crc_internal::ExtendCrc32cInline(&crc, buf_to_add.data(),
                                         buf_to_add.size())) {
      return crc32c_t{crc};
    }
  }
  return crc_internal::ExtendCrc32cInternal(initial_crc, buf_to_add);
}